

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

OptimizerResult
TasGrid::Optimizer::performSecantSearch<(TasGrid::TypeOneDRule)15>
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double left,double right)

{
  OptimizerResult *__a;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  OptimizerResult OVar1;
  OptimizerResult future;
  undefined1 auStack_48 [4];
  int iterations;
  OptimizerResult past;
  anon_class_8_1_c685f059 func;
  double right_local;
  double left_local;
  CurrentNodes<(TasGrid::TypeOneDRule)15> *current_local;
  OptimizerResult present;
  
  past.value = (double)current;
  _auStack_48 = performSecantSearch<(TasGrid::TypeOneDRule)15>::anon_class_8_1_c685f059::operator()
                          ((anon_class_8_1_c685f059 *)&past.value,left);
  __a = (OptimizerResult *)&past.value;
  _current_local =
       performSecantSearch<(TasGrid::TypeOneDRule)15>::anon_class_8_1_c685f059::operator()
                 ((anon_class_8_1_c685f059 *)__a,right);
  ::std::abs((int)__a);
  ::std::abs((int)__a);
  if (extraout_XMM0_Qa < extraout_XMM0_Qa_00) {
    __a = (OptimizerResult *)auStack_48;
    ::std::swap<TasGrid::Optimizer::OptimizerResult>(__a,(OptimizerResult *)&current_local);
  }
  for (future.value._4_4_ = 0; ::std::abs((int)__a),
      3e-12 < extraout_XMM0_Qa_01 && future.value._4_4_ < 1000;
      future.value._4_4_ = future.value._4_4_ + 1) {
    __a = (OptimizerResult *)&past.value;
    OVar1 = performSecantSearch<(TasGrid::TypeOneDRule)15>::anon_class_8_1_c685f059::operator()
                      ((anon_class_8_1_c685f059 *)__a,
                       (double)current_local -
                       (present.node * ((double)current_local - _auStack_48)) /
                       (present.node - past.node));
    _auStack_48 = _current_local;
    _current_local = OVar1;
  }
  return _current_local;
}

Assistant:

OptimizerResult performSecantSearch(CurrentNodes<rule> const& current, double left, double right){
    auto func = [&](double x)->OptimizerResult{ return {x, getDerivative<rule>(current, x)}; };

    OptimizerResult past    = func(left);
    OptimizerResult present = func(right);

    if (std::abs(past.value) < std::abs(present.value))
        std::swap(past, present);

    int iterations = 0;
    while((std::abs(present.value) > 3.0 * Maths::num_tol) && (iterations < 1000)){ // 1000 guards against stagnation
        OptimizerResult future = func(present.node - present.value * (present.node - past.node) / (present.value - past.value));
        past    = present;
        present = future;
        iterations++;
    }

    return present;
}